

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void aura_hexdump(char *desc,void *addr,int len)

{
  uchar *pc;
  uchar buff [17];
  int i;
  int len_local;
  void *addr_local;
  char *desc_local;
  
  if (desc != (char *)0x0) {
    printf("%s:\n",desc);
  }
  for (stack0xffffffffffffffe0 = 0; (int)stack0xffffffffffffffe0 < len;
      register0x00000000 = stack0xffffffffffffffe0 + 1) {
    if ((int)stack0xffffffffffffffe0 % 0x10 == 0) {
      if (stack0xffffffffffffffe0 != 0) {
        printf("  %s\n",&pc);
      }
      printf("  %04x ",(ulong)stack0xffffffffffffffe0);
    }
    printf(" %02x",(ulong)*(byte *)((long)addr + (long)(int)stack0xffffffffffffffe0));
    if ((*(byte *)((long)addr + (long)(int)stack0xffffffffffffffe0) < 0x20) ||
       (0x7e < *(byte *)((long)addr + (long)(int)stack0xffffffffffffffe0))) {
      buff[(long)((int)stack0xffffffffffffffe0 % 0x10) + -8] = '.';
    }
    else {
      buff[(long)((int)stack0xffffffffffffffe0 % 0x10) + -8] =
           *(uchar *)((long)addr + (long)(int)stack0xffffffffffffffe0);
    }
    buff[(long)((int)stack0xffffffffffffffe0 % 0x10 + 1) + -8] = '\0';
  }
  for (; (int)stack0xffffffffffffffe0 % 0x10 != 0; register0x00000000 = stack0xffffffffffffffe0 + 1)
  {
    printf("   ");
  }
  printf("  %s\n",&pc);
  return;
}

Assistant:

void aura_hexdump(char *desc, void *addr, int len)
{
	int i;
	unsigned char buff[17];
	unsigned char *pc = (unsigned char *)addr;

	if (desc != NULL)
		printf("%s:\n", desc);

	for (i = 0; i < len; i++) {
		if ((i % 16) == 0) {
			if (i != 0)
				printf("  %s\n", buff);
			printf("  %04x ", i);
		}

		printf(" %02x", pc[i]);
		if ((pc[i] < 0x20) || (pc[i] > 0x7e))
			buff[i % 16] = '.';
		else
			buff[i % 16] = pc[i];
		buff[(i % 16) + 1] = '\0';
	}

	while ((i % 16) != 0) {
		printf("   ");
		i++;
	}

	printf("  %s\n", buff);
}